

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O2

QHttp2Stream * __thiscall
QHttp2Connection::createStreamInternal_impl(QHttp2Connection *this,quint32 streamID)

{
  long lVar1;
  bool bVar2;
  QHttp2Stream *this_00;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  QObject *pQVar6;
  QWeakPointer<QObject> *this_01;
  QObject *pQVar7;
  QHttp2Stream *pQVar8;
  long in_FS_OFFSET;
  uint in_stack_ffffffffffffff3c;
  Data *pDStack_a0;
  QHttp2Connection *local_98;
  QWeakPointer<QObject> QStack_90;
  QObject local_78 [12];
  quint32 streamID_local;
  code *local_68;
  undefined8 local_60;
  TryEmplaceResult local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  streamID_local = streamID;
  if ((*(int *)(this + 0x10) == 0) && (this[0x2b0] == (QHttp2Connection)0x0)) {
    bVar2 = sendClientPreface(this);
    if (bVar2) goto LAB_001d6b24;
    qHttp2ConnectionLog();
    if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        != 0) {
      local_58.iterator.i.d._0_4_ = 2;
      local_58.iterator.i.d._4_4_ = 0;
      local_58.iterator.i.bucket._0_4_ = 0;
      local_58.iterator.i.bucket._4_4_ = 0;
      local_58.inserted = false;
      local_58._17_3_ = 0;
      local_58._20_4_ = 0;
      local_40 = qHttp2ConnectionLog::category.name;
      pQVar8 = (QHttp2Stream *)0x0;
      QMessageLogger::warning((char *)&local_58,"[%p] Failed to send client preface",this);
      goto LAB_001d6d85;
    }
  }
  else {
LAB_001d6b24:
    local_58.inserted = true;
    local_58._17_3_ = 0xaaaaaa;
    local_58._20_4_ = 0xaaaaaaaa;
    local_58.iterator.i.d._0_4_ = 0xaaaaaaaa;
    local_58.iterator.i.d._4_4_ = 0xaaaaaaaa;
    local_58.iterator.i.bucket._0_4_ = 0xaaaaaaaa;
    local_58.iterator.i.bucket._4_4_ = 0xaaaaaaaa;
    local_98 = (QHttp2Connection *)0x0;
    QHash<unsigned_int,QPointer<QHttp2Stream>>::
    tryEmplace_impl<unsigned_int_const&,decltype(nullptr)>
              (&local_58,this + 0x1c0,&streamID_local,&local_98);
    if (local_58.inserted == true) {
      lVar1 = *(long *)(CONCAT44(local_58.iterator.i.d._4_4_,local_58.iterator.i.d._0_4_) + 0x20);
      lVar4 = (CONCAT44(local_58.iterator.i.bucket._4_4_,(uint)local_58.iterator.i.bucket) >> 7) *
              0x90;
      lVar1 = *(long *)(lVar1 + 0x80 + lVar4) +
              (ulong)*(byte *)((ulong)((uint)local_58.iterator.i.bucket & 0x7f) + lVar1 + lVar4) *
              0x18;
      this_01 = (QWeakPointer<QObject> *)(lVar1 + 8);
      this_00 = (QHttp2Stream *)operator_new(0x90);
      QHttp2Stream::QHttp2Stream(this_00,(QHttp2Connection *)this,streamID_local);
      QWeakPointer<QObject>::assign<QObject>(this_01,(QObject *)this_00);
      pDStack_a0 = this_01->d;
      if (pDStack_a0 == (Data *)0x0) {
        _DAT_00000018 = *(undefined4 *)(this + 0x2a0);
        pQVar7 = *(QObject **)(lVar1 + 0x10);
        pDStack_a0 = (Data *)0x0;
        pQVar6 = (QObject *)0x0;
        _DAT_00000014 = *(undefined4 *)(this + 0x298);
      }
      else {
        pQVar7 = *(QObject **)(lVar1 + 0x10);
        *(undefined4 *)(pQVar7 + 0x14) = *(undefined4 *)(this + 0x298);
        *(undefined4 *)(pQVar7 + 0x18) = *(undefined4 *)(this + 0x2a0);
        pQVar6 = (QObject *)0x0;
        if ((pDStack_a0->strongref)._q_value.super___atomic_base<int>._M_i != 0) {
          pQVar6 = pQVar7;
        }
        LOCK();
        (pDStack_a0->weakref)._q_value.super___atomic_base<int>._M_i =
             (pDStack_a0->weakref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        QStack_90.d = pDStack_a0;
        QStack_90.value = pQVar7;
      }
      local_68 = QHttp2Stream::uploadBlocked;
      local_60 = 0;
      local_98 = this;
      puVar3 = (undefined4 *)operator_new(0x28);
      *puVar3 = 1;
      *(code **)(puVar3 + 2) =
           QtPrivate::
           QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qhttp2connection.cpp:934:57),_QtPrivate::List<>,_void>
           ::impl;
      *(QHttp2Connection **)(puVar3 + 4) = this;
      *(Data **)(puVar3 + 6) = pDStack_a0;
      *(QObject **)(puVar3 + 8) = pQVar7;
      QStack_90.d = (Data *)0x0;
      QStack_90.value = (QObject *)0x0;
      pQVar8 = (QHttp2Stream *)0x0;
      QObject::connectImpl
                (local_78,(void **)pQVar6,(QObject *)&local_68,(void **)this,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar3,(int *)((ulong)in_stack_ffffffffffffff3c << 0x20),
                 (QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_78);
      QWeakPointer<QObject>::~QWeakPointer(&QStack_90);
      lVar1 = *(long *)(CONCAT44(local_58.iterator.i.d._4_4_,local_58.iterator.i.d._0_4_) + 0x20);
      lVar4 = (CONCAT44(local_58.iterator.i.bucket._4_4_,(uint)local_58.iterator.i.bucket) >> 7) *
              0x90;
      QWeakPointer<QObject>::operator=
                ((QWeakPointer<QObject> *)
                 (*(long *)(lVar1 + 0x80 + lVar4) +
                  (ulong)*(byte *)((ulong)((uint)local_58.iterator.i.bucket & 0x7f) + lVar1 + lVar4)
                  * 0x18 + 8),this_01);
      lVar1 = *(long *)(CONCAT44(local_58.iterator.i.d._4_4_,local_58.iterator.i.d._0_4_) + 0x20);
      lVar5 = (CONCAT44(local_58.iterator.i.bucket._4_4_,(uint)local_58.iterator.i.bucket) >> 7) *
              0x90;
      lVar4 = *(long *)(lVar1 + 0x80 + lVar5);
      lVar5 = (ulong)*(byte *)((ulong)((uint)local_58.iterator.i.bucket & 0x7f) + lVar1 + lVar5) *
              0x18;
      lVar1 = *(long *)(lVar4 + 8 + lVar5);
      if (lVar1 == 0) goto LAB_001d6d85;
      if (*(int *)(lVar1 + 4) != 0) {
        pQVar8 = *(QHttp2Stream **)(lVar4 + 0x10 + lVar5);
        goto LAB_001d6d85;
      }
    }
  }
  pQVar8 = (QHttp2Stream *)0x0;
LAB_001d6d85:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar8;
  }
  __stack_chk_fail();
}

Assistant:

QHttp2Stream *QHttp2Connection::createStreamInternal_impl(quint32 streamID)
{
    Q_ASSERT(streamID > m_lastIncomingStreamID || streamID >= m_nextStreamID);

    if (m_connectionType == Type::Client && !m_prefaceSent && !sendClientPreface()) {
        qCWarning(qHttp2ConnectionLog, "[%p] Failed to send client preface", this);
        return nullptr;
    }

    auto result = m_streams.tryEmplace(streamID, nullptr);
    if (!result.inserted)
        return nullptr;
    QPointer<QHttp2Stream> &stream = result.iterator.value();
    stream = new QHttp2Stream(this, streamID);
    stream->m_recvWindow = streamInitialReceiveWindowSize;
    stream->m_sendWindow = streamInitialSendWindowSize;

    connect(stream, &QHttp2Stream::uploadBlocked, this, [this, stream] {
        m_blockedStreams.insert(stream->streamID());
    });
    *result.iterator = stream;
    return *result.iterator;
}